

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

Abc_Obj_t * Abc_SclFindCriticalCo(SC_Man *p,int *pfRise)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  SC_Pair *pSVar2;
  SC_Pair *pArr;
  int i;
  float fMaxArr;
  Abc_Obj_t *pPivot;
  Abc_Obj_t *pObj;
  int *pfRise_local;
  SC_Man *p_local;
  
  _i = (Abc_Obj_t *)0x0;
  pArr._4_4_ = 0.0;
  iVar1 = Abc_NtkPoNum(p->pNtk);
  if (iVar1 < 1) {
    __assert_fail("Abc_NtkPoNum(p->pNtk) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.c"
                  ,0x39,"Abc_Obj_t *Abc_SclFindCriticalCo(SC_Man *, int *)");
  }
  for (pArr._0_4_ = 0; iVar1 = Abc_NtkCoNum(p->pNtk), (int)pArr < iVar1; pArr._0_4_ = (int)pArr + 1)
  {
    pObj_00 = Abc_NtkCo(p->pNtk,(int)pArr);
    pSVar2 = Abc_SclObjTime(p,pObj_00);
    if (pArr._4_4_ < pSVar2->rise) {
      pArr._4_4_ = pSVar2->rise;
      *pfRise = 1;
      _i = pObj_00;
    }
    if (pArr._4_4_ < pSVar2->fall) {
      pArr._4_4_ = pSVar2->fall;
      *pfRise = 0;
      _i = pObj_00;
    }
  }
  if ((pArr._4_4_ == 0.0) && (!NAN(pArr._4_4_))) {
    _i = Abc_NtkPo(p->pNtk,0);
  }
  if (_i == (Abc_Obj_t *)0x0) {
    __assert_fail("pPivot != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclSize.c"
                  ,0x42,"Abc_Obj_t *Abc_SclFindCriticalCo(SC_Man *, int *)");
  }
  return _i;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finding most critical objects.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Abc_SclFindCriticalCo( SC_Man * p, int * pfRise )
{
    Abc_Obj_t * pObj, * pPivot = NULL;
    float fMaxArr = 0;
    int i;
    assert( Abc_NtkPoNum(p->pNtk) > 0 );
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        SC_Pair * pArr = Abc_SclObjTime( p, pObj );
        if ( fMaxArr < pArr->rise )  fMaxArr = pArr->rise, *pfRise = 1, pPivot = pObj;
        if ( fMaxArr < pArr->fall )  fMaxArr = pArr->fall, *pfRise = 0, pPivot = pObj;
    }
    if ( fMaxArr == 0 )
        pPivot = Abc_NtkPo(p->pNtk, 0);
    assert( pPivot != NULL );
    return pPivot;
}